

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.h
# Opt level: O0

int __thiscall
TPZIntelGen<pzshape::TPZShapePrism>::ClassId(TPZIntelGen<pzshape::TPZShapePrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string *str;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string local_28 [8];
  TPZInterpolatedElement *in_stack_ffffffffffffffe0;
  
  str = (string *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  uVar1 = Hash(str);
  iVar2 = TPZInterpolatedElement::ClassId(in_stack_ffffffffffffffe0);
  pzshape::TPZShapePrism::TPZShapePrism
            ((TPZShapePrism *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  iVar3 = pztopology::TPZPrism::ClassId((TPZPrism *)in_stack_ffffffffffffffd0);
  uVar1 = uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
  pzshape::TPZShapePrism::~TPZShapePrism((TPZShapePrism *)0x1a1743a);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1;
}

Assistant:

int TPZIntelGen<TSHAPE>::ClassId() const{
    return Hash("TPZIntelGen") ^ TPZInterpolatedElement::ClassId() << 1 ^ TSHAPE().ClassId() << 2;
}